

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O3

void * rw::d3d8::driverOpen(void *o,int32 param_2,int32 param_3)

{
  long lVar1;
  long lVar2;
  ObjPipeline *this;
  undefined4 in_register_00000014;
  
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d8.cpp line: 362"
  ;
  this = (ObjPipeline *)(*DAT_0014ada8)(0x40,0x40000,CONCAT44(in_register_00000014,param_3));
  rw::ObjPipeline::init(this,(EVP_PKEY_CTX *)0x8);
  (this->impl).instance = instance;
  (this->impl).uninstance = uninstance;
  (this->impl).render = render;
  *(code **)&this[1].super_Pipeline = defaultInstanceCB;
  *(code **)&this[1].super_Pipeline.platform = defaultUninstanceCB;
  this[1].impl.instance = defaultRenderCB;
  **(undefined8 **)(engine + 0x98) = this;
  lVar2 = engine;
  lVar1 = *(long *)(engine + 0x98);
  *(undefined4 *)(lVar1 + 8) = d3d::nativeRasterOffset;
  *(code **)(lVar1 + 0x10) = d3d::rasterCreate;
  *(code **)(*(long *)(lVar2 + 0x98) + 0x18) = d3d::rasterLock;
  *(code **)(*(long *)(lVar2 + 0x98) + 0x20) = d3d::rasterUnlock;
  *(code **)(*(long *)(lVar2 + 0x98) + 0x38) = d3d::rasterNumLevels;
  *(code **)(*(long *)(lVar2 + 0x98) + 0x40) = d3d::imageFindRasterFormat;
  *(code **)(*(long *)(lVar2 + 0x98) + 0x48) = d3d::rasterFromImage;
  *(code **)(*(long *)(lVar2 + 0x98) + 0x50) = d3d::rasterToImage;
  return o;
}

Assistant:

static void*
driverOpen(void *o, int32, int32)
{
	engine->driver[PLATFORM_D3D8]->defaultPipeline = makeDefaultPipeline();

	engine->driver[PLATFORM_D3D8]->rasterNativeOffset = nativeRasterOffset;
	engine->driver[PLATFORM_D3D8]->rasterCreate       = rasterCreate;
	engine->driver[PLATFORM_D3D8]->rasterLock         = rasterLock;
	engine->driver[PLATFORM_D3D8]->rasterUnlock       = rasterUnlock;
	engine->driver[PLATFORM_D3D8]->rasterNumLevels    = rasterNumLevels;
	engine->driver[PLATFORM_D3D8]->imageFindRasterFormat = imageFindRasterFormat;
	engine->driver[PLATFORM_D3D8]->rasterFromImage    = rasterFromImage;
	engine->driver[PLATFORM_D3D8]->rasterToImage      = rasterToImage;
	return o;
}